

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

L12_subband_alloc_t * L12_subband_alloc_table(uint8_t *hdr,L12_scale_info *sci)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  uint8_t *in_RDI;
  uint kbps;
  int sample_rate_idx;
  int stereo_bands;
  int nbands;
  int mode;
  L12_subband_alloc_t *alloc;
  undefined1 local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_20;
  L12_subband_alloc_t *local_18;
  
  iVar1 = (int)(uint)in_RDI[3] >> 6;
  if (iVar1 == 3) {
    local_30 = 0;
  }
  else {
    if (iVar1 == 1) {
      local_34 = ((int)(uint)in_RDI[3] >> 4 & 3U) * 4 + 4;
    }
    else {
      local_34 = 0x20;
    }
    local_30 = local_34;
  }
  if ((in_RDI[1] & 6) == 6) {
    local_18 = L12_subband_alloc_table::g_alloc_L1;
    local_20 = 0x20;
  }
  else if ((in_RDI[1] & 8) == 0) {
    local_18 = L12_subband_alloc_table::g_alloc_L2M2;
    local_20 = 0x1e;
  }
  else {
    uVar2 = (int)(uint)in_RDI[2] >> 2 & 3;
    local_2c = hdr_bitrate_kbps(in_RDI);
    local_2c = local_2c >> (iVar1 != 3);
    if (local_2c == 0) {
      local_2c = 0xc0;
    }
    local_18 = L12_subband_alloc_table::g_alloc_L2M1;
    local_20 = 0x1b;
    if (local_2c < 0x38) {
      local_18 = L12_subband_alloc_table::g_alloc_L2M1_lowrate;
      local_20 = 8;
      if (uVar2 == 2) {
        local_20 = 0xc;
      }
    }
    else if ((0x5f < local_2c) && (uVar2 != 1)) {
      local_20 = 0x1e;
    }
  }
  local_38 = (undefined1)local_20;
  *(undefined1 *)(in_RSI + 0x300) = local_38;
  if (local_30 <= local_20) {
    local_38 = (undefined1)local_30;
  }
  *(undefined1 *)(in_RSI + 0x301) = local_38;
  return local_18;
}

Assistant:

static const L12_subband_alloc_t *L12_subband_alloc_table(const uint8_t *hdr, L12_scale_info *sci)
{
    const L12_subband_alloc_t *alloc;
    int mode = HDR_GET_STEREO_MODE(hdr);
    int nbands, stereo_bands = (mode == MODE_MONO) ? 0 : (mode == MODE_JOINT_STEREO) ? (HDR_GET_STEREO_MODE_EXT(hdr) << 2) + 4 : 32;

    if (HDR_IS_LAYER_1(hdr))
    {
        static const L12_subband_alloc_t g_alloc_L1[] = { { 76, 4, 32 } };
        alloc = g_alloc_L1;
        nbands = 32;
    } else if (!HDR_TEST_MPEG1(hdr))
    {
        static const L12_subband_alloc_t g_alloc_L2M2[] = { { 60, 4, 4 }, { 44, 3, 7 }, { 44, 2, 19 } };
        alloc = g_alloc_L2M2;
        nbands = 30;
    } else
    {
        static const L12_subband_alloc_t g_alloc_L2M1[] = { { 0, 4, 3 }, { 16, 4, 8 }, { 32, 3, 12 }, { 40, 2, 7 } };
        int sample_rate_idx = HDR_GET_SAMPLE_RATE(hdr);
        unsigned kbps = hdr_bitrate_kbps(hdr) >> (int)(mode != MODE_MONO);
        if (!kbps) /* free-format */
        {
            kbps = 192;
        }

        alloc = g_alloc_L2M1;
        nbands = 27;
        if (kbps < 56)
        {
            static const L12_subband_alloc_t g_alloc_L2M1_lowrate[] = { { 44, 4, 2 }, { 44, 3, 10 } };
            alloc = g_alloc_L2M1_lowrate;
            nbands = sample_rate_idx == 2 ? 12 : 8;
        } else if (kbps >= 96 && sample_rate_idx != 1)
        {
            nbands = 30;
        }
    }

    sci->total_bands = (uint8_t)nbands;
    sci->stereo_bands = (uint8_t)MINIMP3_MIN(stereo_bands, nbands);

    return alloc;
}